

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuMatrix.c
# Opt level: O2

Fxu_Cube * Fxu_MatrixAddCube(Fxu_Matrix *p,Fxu_Var *pVar,int iCube)

{
  Fxu_Cube *pLink;
  
  pLink = (Fxu_Cube *)Fxu_MemFetch(p,0x48);
  pLink->pVar = (Fxu_Var *)0x0;
  (pLink->lLits).pHead = (Fxu_Lit *)0x0;
  *(undefined8 *)pLink = 0;
  pLink->pFirst = (Fxu_Cube *)0x0;
  pLink->pOrder = (Fxu_Cube *)0x0;
  (pLink->lLits).pTail = (Fxu_Lit *)0x0;
  *(undefined8 *)&(pLink->lLits).nItems = 0;
  pLink->pPrev = (Fxu_Cube *)0x0;
  pLink->pNext = (Fxu_Cube *)0x0;
  pLink->pVar = pVar;
  pLink->iCube = iCube;
  Fxu_ListMatrixAddCube(p,pLink);
  return pLink;
}

Assistant:

Fxu_Cube * Fxu_MatrixAddCube( Fxu_Matrix * p, Fxu_Var * pVar, int iCube )
{
	Fxu_Cube * pCube;
	pCube = MEM_ALLOC_FXU( p, Fxu_Cube, 1 );
	memset( pCube, 0, sizeof(Fxu_Cube) );
	pCube->pVar  = pVar;
	pCube->iCube = iCube;
	Fxu_ListMatrixAddCube( p, pCube );
	return pCube;
}